

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall node::runPrepare(node *this)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *this_00;
  size_t *psVar1;
  pointer pcVar2;
  bool bVar3;
  list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
  *this_01;
  char cVar4;
  pointer pbVar5;
  _Node *p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pbVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  p;
  string tmp;
  long *local_e8 [2];
  long local_d8 [2];
  node *local_c8;
  undefined8 local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  ulong local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  local_a8;
  long *local_80 [2];
  long local_70 [2];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  ulong local_40;
  list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
  *local_38;
  
  this_00 = &this->labels;
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
            );
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node._M_size = 0;
  local_b8 = &this->code;
  local_38 = (list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
              *)this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(local_b8,(long)(this->inputCode).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->inputCode).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar8 = (this->inputCode).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->inputCode).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = this;
  if (pbVar5 != pbVar8) {
    uVar12 = 0;
    local_c0 = 0;
    do {
      if (pbVar5 == pbVar8) {
LAB_0010ca64:
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((local_c8->code).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12));
        pbVar8 = (local_c8->inputCode).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_b0 = 0;
        uVar14 = 0;
        uVar13 = 1;
        local_40 = uVar12;
        do {
          local_e8[0] = local_d8;
          pcVar2 = pbVar8[uVar12]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e8,pcVar2,pcVar2 + pbVar8[uVar12]._M_string_length);
          cVar4 = *(char *)((long)local_e8[0] + uVar14);
          local_60 = &local_50;
          local_58 = 0;
          local_50 = 0;
          if (cVar4 == ':') {
            local_a8.first._M_dataplus._M_p = (pointer)&local_a8.first.field_2;
            local_a8.first._M_string_length = 0;
            local_a8.first.field_2._M_local_buf[0] = '\0';
            local_a8.second = '\0';
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_e8);
            std::__cxx11::string::operator=((string *)&local_a8,(string *)local_80);
            this_01 = local_38;
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            local_a8.second = (uchar)local_c0;
            p_Var6 = std::__cxx11::
                     list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
                     ::_M_create_node<std::pair<std::__cxx11::string,unsigned_char>const&>
                               (this_01,&local_a8);
            std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
            psVar1 = &(local_c8->labels).
                      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_e8);
            std::__cxx11::string::find_first_not_of((char *)local_80,0x1100ee,0);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_e8);
            std::__cxx11::string::operator=
                      ((string *)
                       ((local_b8->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar12),(string *)local_80);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            paVar7 = &local_a8.first.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8.first._M_dataplus._M_p != paVar7) {
              operator_delete(local_a8.first._M_dataplus._M_p,
                              CONCAT71(local_a8.first.field_2._M_allocated_capacity._1_7_,
                                       local_a8.first.field_2._M_local_buf[0]) + 1);
              paVar7 = extraout_RAX;
            }
            local_b0 = CONCAT71((int7)((ulong)paVar7 >> 8),1);
            if (local_60 != &local_50) {
              operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
            }
          }
          if (local_e8[0] != local_d8) {
            operator_delete(local_e8[0],local_d8[0] + 1);
          }
          pbVar8 = (local_c8->inputCode).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while ((cVar4 != ':') &&
                (bVar3 = uVar13 < (ulong)((long)(local_c8->inputCode).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar8 >> 5), uVar14 = uVar13,
                uVar13 = (ulong)((int)uVar13 + 1), bVar3));
        uVar12 = local_40;
        if ((local_b0 & 1) == 0) goto LAB_0010ca64;
      }
      cVar4 = (char)local_c0 + '\x01';
      local_c0 = CONCAT71((int7)((ulong)local_c0 >> 8),cVar4);
      uVar12 = (ulong)cVar4;
      pbVar5 = (local_c8->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)pbVar5 - (long)pbVar8 >> 5));
  }
  pbVar5 = (local_c8->code).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (local_c8->code).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar5) {
    uVar12 = 0;
    do {
      uVar14 = pbVar5[uVar12]._M_string_length;
      if (uVar14 != 0) {
        uVar13 = 0;
        do {
          if (pbVar5[uVar12]._M_dataplus._M_p[uVar13] == ':') {
            return false;
          }
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
        uVar11 = (int)uVar14 - 1;
        if (-1 < (int)uVar11) {
          uVar14 = uVar14 & 0xffffffff;
          lVar9 = (ulong)uVar11 + 1;
          do {
            pbVar5 = (local_b8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            cVar4 = pbVar5[uVar12]._M_dataplus._M_p[lVar9 + -1];
            if ((cVar4 != ',') && (cVar4 != ' ')) {
              std::__cxx11::string::erase((ulong)(pbVar5 + uVar12),uVar14);
            }
            if ((cVar4 != ',') && (cVar4 != ' ')) break;
            uVar14 = uVar14 - 1;
            lVar10 = lVar9 + -1;
            bVar3 = 0 < lVar9;
            lVar9 = lVar10;
          } while (lVar10 != 0 && bVar3);
          pbVar5 = (local_c8->code).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 = (local_c8->code).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (uVar12 < (ulong)((long)pbVar8 - (long)pbVar5 >> 5));
  }
  return true;
}

Assistant:

bool node::runPrepare(){
  std::vector<int> labelLines;
  labels.clear();
  code.resize(inputCode.size());
  for (int8_t i = 0; i < inputCode.size(); i++){
    bool label=false;
    for(unsigned int j=0;j<inputCode.size();j++){
      string line=inputCode[i];
      char ch=line[j];
      string tmp;      
      if(ch==':'){
	std::pair<std::string, uint8_t> p;
	int c;
	p.first=line.substr(0,j);
	p.second=i;
	labels.push_back(p);
	label=true;
	c=line.substr(j+1).find_first_not_of(" ");
	code[i]=line.substr(c+j+1);
	break;
      }
    }
    if(label==false){
      code[i]=inputCode[i];
    }
  }
  for(int i=0; i<labelLines.size();i++){
    string operand;
    bool label_exists=false;
    operand=code[labelLines[i]].substr(4);
    for(list<pair<string, uint8_t> >::iterator j=labels.begin();j!=labels.end();j++){
      if(j->first==operand){
	label_exists=true;
	break;
      }
    }
    if(label_exists==false)
      return false;
  }
  for(unsigned int i=0;i<code.size();i++){
    bool space=false;
    int  remove_count=0;
    for(int j=0; j<code[i].length();j++){
      char ch=code[i].c_str()[j];
      if(ch == ' '||ch==','){
	if(space){
	  code[i].erase(j, 1);              //get rid of whitespace
	  j--;
	}
	space=true;
      }
      if(ch==':')
	return false;
      else
	space=false;
    }
    for(int j=code[i].length()-1;j>=0;j--){
      char ch=code[i].c_str()[j];
      if(ch==' '||ch==',')
	remove_count++;
      else{
	code[i].erase(j+1, remove_count);
	break;
      }
    }
  }
  return true;
}